

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void lowbd_fwd_txfm2d_64x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  __m256i *buf;
  int i_1;
  int j;
  int i;
  int height_div16;
  int width_div16;
  transform_1d_avx2_conflict1 row_txfm;
  transform_1d_avx2_conflict1 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf1 [64];
  __m256i buf0 [64];
  TX_SIZE tx_size;
  int in_stack_ffffffffffffef40;
  int in_stack_ffffffffffffef44;
  __m256i *in_stack_ffffffffffffef48;
  undefined8 in_stack_ffffffffffffef50;
  __m256i *in;
  undefined4 in_stack_ffffffffffffef58;
  undefined4 in_stack_ffffffffffffef5c;
  int iVar4;
  int local_10a0;
  int local_109c;
  int size;
  longlong local_1060 [51];
  __m256i *in_stack_fffffffffffff138;
  __m256i *in_stack_fffffffffffff140;
  int8_t in_stack_fffffffffffff3bf;
  __m256i *in_stack_fffffffffffff3c0;
  __m256i *in_stack_fffffffffffff3c8;
  
  iVar1 = get_txw_idx('\x12');
  iVar2 = get_txh_idx('\x12');
  iVar3 = (int)av1_fwd_cos_bit_col[iVar1][iVar2];
  iVar1 = (int)av1_fwd_cos_bit_row[iVar1][iVar2];
  size = 0x40;
  iVar2 = 0x10;
  for (local_109c = 0; local_109c < 4; local_109c = local_109c + 1) {
    load_buffer_16bit_to_16bit_avx2
              ((int16_t *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),
               (int)((ulong)in_stack_ffffffffffffef50 >> 0x20),in_stack_ffffffffffffef48,
               in_stack_ffffffffffffef44);
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    fdct16x16_new_avx2(in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bf
                      );
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    for (local_10a0 = 0; local_10a0 < 1; local_10a0 = local_10a0 + 1) {
      transpose_16bit_16x16_avx2(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    }
  }
  for (iVar4 = 0; iVar4 < 1; iVar4 = iVar4 + 1) {
    in = (__m256i *)(local_1060 + (long)(iVar4 << 6) * 4);
    fdct16x64_new_avx2((__m256i *)buf1[1][1],(__m256i *)buf1[1][0],buf1[0][3]._7_1_);
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    store_buffer_16bit_to_32bit_w16_avx2
              (in,(int32_t *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef44,
               in_stack_ffffffffffffef40);
  }
  memset((void *)(in_RSI + 0x800),0,0x800);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X16;
  __m256i buf0[64], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x16_new_avx2;
  const transform_1d_avx2 row_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < height_div16; ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < height_div16; i++) {
    __m256i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + 16 * i, 16, 32);
  }
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
}